

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O2

void __thiscall read_single_file::test_method(read_single_file *this)

{
  bool bVar1;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  long local_120 [2];
  shared_count sStack_110;
  undefined1 local_108 [24];
  char *local_f0;
  EventRegistry registry;
  char *local_d0;
  char *local_c8;
  LicenseReader licenseReader;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  LicenseLocation location;
  
  location.licenseFileLocation =
       "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/test_reader.ini"
  ;
  location.environmentVariableName = (char *)0x0;
  location.openFileNearModule = false;
  license::LicenseReader::LicenseReader(&licenseReader,&location);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_108,"PrODUCT",(allocator *)local_120);
  license::LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_108,&licenseInfos);
  std::__cxx11::string::~string((string *)local_108);
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x13);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_120[0] = CONCAT71(local_120[0]._1_7_,bVar1);
  local_120[1] = 0;
  sStack_110.pi_ = (sp_counted_base *)0x0;
  local_f0 = (char *)&local_d0;
  local_d0 = "registry.isGood()";
  local_c8 = "";
  local_108[8] = 0;
  local_108._0_8_ = &PTR__lazy_ostream_0059deb0;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion(local_120,local_108,&local_70,0x13,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_110);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x14);
  local_108[8] = 0;
  local_108._0_8_ = &PTR__lazy_ostream_0059df00;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_98 = "";
  local_d0 = (char *)CONCAT44(local_d0._4_4_,1);
  local_120[0] = (long)licenseInfos.
                       super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)licenseInfos.
                       super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
            (local_108,&local_a0,0x14,1,2,&local_d0,"1",local_120,"licenseInfos.size()");
  std::_Vector_base<AuditEvent,_std::allocator<AuditEvent>_>::~_Vector_base
            ((_Vector_base<AuditEvent,_std::allocator<AuditEvent>_> *)&registry);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&licenseInfos);
  license::LicenseReader::~LicenseReader(&licenseReader);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( read_single_file ) {
	const char * licLocation =
	PROJECT_TEST_SRC_DIR "/library/test_reader.ini";
	const LicenseLocation location = { licLocation, NULL, false };
	LicenseReader licenseReader(location);
	vector<FullLicenseInfo> licenseInfos;
	EventRegistry registry = licenseReader.readLicenses("PrODUCT",
			licenseInfos);
	BOOST_CHECK(registry.isGood());
	BOOST_CHECK_EQUAL(1, licenseInfos.size());
}